

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Directives.cpp
# Opt level: O2

bool DirectiveRelativeInclude(ArgumentList *List,int flags)

{
  pointer __lhs;
  bool bVar1;
  
  __lhs = (List->entries).
          super__Vector_base<ArgumentList::Entry,_std::allocator<ArgumentList::Entry>_>._M_impl.
          super__Vector_impl_data._M_start;
  if (((long)(List->entries).
             super__Vector_base<ArgumentList::Entry,_std::allocator<ArgumentList::Entry>_>._M_impl.
             super__Vector_impl_data._M_finish - (long)__lhs != 0x28) ||
     (bVar1 = std::operator==(&__lhs->text,L"on"), bVar1)) {
    Global.relativeInclude = true;
  }
  else {
    bVar1 = std::operator==(&((List->entries).
                              super__Vector_base<ArgumentList::Entry,_std::allocator<ArgumentList::Entry>_>
                              ._M_impl.super__Vector_impl_data._M_start)->text,L"off");
    if (!bVar1) {
      Logger::printError<>(Error,L"Invalid arguments");
      return false;
    }
    Global.relativeInclude = false;
  }
  return true;
}

Assistant:

bool DirectiveRelativeInclude(ArgumentList& List, int flags)
{
	if (List.size() == 1)
	{
		if (List[0].text == L"on")
		{
			Global.relativeInclude = true;
		} else if (List[0].text == L"off")
		{
			Global.relativeInclude = false;
		} else {
			Logger::printError(Logger::Error,L"Invalid arguments");
			return false;
		}
	} else {
		Global.relativeInclude = true;
	}
	return true;
}